

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::php::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  ulong uVar1;
  protobuf *ppVar2;
  char *pcVar3;
  _anonymous_namespace_ *p_Var4;
  Options *pOVar5;
  pointer ppFVar6;
  size_type __val;
  pointer pbVar7;
  ZeroCopyOutputStream *pZVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  pointer pbVar12;
  LogMessage *pLVar13;
  FileDescriptorProto *output;
  FileDescriptor *pFVar14;
  FileDescriptorProto *options_00;
  size_type sVar15;
  Options *options_01;
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *file;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *extraout_RDX_03;
  FileDescriptor *extraout_RDX_04;
  FileDescriptor *extraout_RDX_05;
  FileDescriptor *extraout_RDX_06;
  char cVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *result_00;
  pointer ppFVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  StringPiece full;
  StringPiece full_00;
  StringPiece full_01;
  string serialized;
  string __str;
  string metadata_classname;
  string metadata_c_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  option_pair;
  string c_name;
  string metadata_filename;
  FileDescriptorProto file_proto;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string local_130;
  Options options;
  Printer printer;
  undefined4 extraout_var;
  
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header;
  options.is_descriptor = false;
  options.aggregate_metadata = false;
  options.gen_c_wkt = false;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar2 = (protobuf *)(parameter->_M_dataplus)._M_p;
  pcVar3 = (char *)parameter->_M_string_length;
  result_00 = error;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((long)pcVar3 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)pcVar3,"string length exceeds max size");
  }
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  full.length_ = (size_type)",";
  full.ptr_ = pcVar3;
  SplitStringUsing(ppVar2,full,(char *)&result,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)result_00);
  pbVar7 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar12 = result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      ppVar2 = (protobuf *)(pbVar12->_M_dataplus)._M_p;
      pcVar3 = (char *)pbVar12->_M_string_length;
      if ((long)pcVar3 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  ((size_t)pcVar3,"string length exceeds max size");
      }
      option_pair.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      option_pair.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      option_pair.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      full_00.length_ = (size_type)"=";
      full_00.ptr_ = pcVar3;
      SplitStringUsing(ppVar2,full_00,(char *)&option_pair,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)result_00);
      pcVar3 = ((option_pair.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      uVar20 = (option_pair.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      if ((long)uVar20 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar20,"string length exceeds max size");
      }
      if ((uVar20 < 0x12) ||
         (auVar24[0] = -(*pcVar3 == 'a'), auVar24[1] = -(pcVar3[1] == 'g'),
         auVar24[2] = -(pcVar3[2] == 'g'), auVar24[3] = -(pcVar3[3] == 'r'),
         auVar24[4] = -(pcVar3[4] == 'e'), auVar24[5] = -(pcVar3[5] == 'g'),
         auVar24[6] = -(pcVar3[6] == 'a'), auVar24[7] = -(pcVar3[7] == 't'),
         auVar24[8] = -(pcVar3[8] == 'e'), auVar24[9] = -(pcVar3[9] == '_'),
         auVar24[10] = -(pcVar3[10] == 'm'), auVar24[0xb] = -(pcVar3[0xb] == 'e'),
         auVar24[0xc] = -(pcVar3[0xc] == 't'), auVar24[0xd] = -(pcVar3[0xd] == 'a'),
         auVar24[0xe] = -(pcVar3[0xe] == 'd'), auVar24[0xf] = -(pcVar3[0xf] == 'a'),
         auVar25[0] = -((char)*(undefined2 *)(pcVar3 + 0x10) == 't'),
         auVar25[1] = -((char)((ushort)*(undefined2 *)(pcVar3 + 0x10) >> 8) == 'a'),
         auVar25[2] = 0xff, auVar25[3] = 0xff, auVar25[4] = 0xff, auVar25[5] = 0xff,
         auVar25[6] = 0xff, auVar25[7] = 0xff, auVar25[8] = 0xff, auVar25[9] = 0xff,
         auVar25[10] = 0xff, auVar25[0xb] = 0xff, auVar25[0xc] = 0xff, auVar25[0xd] = 0xff,
         auVar25[0xe] = 0xff, auVar25[0xf] = 0xff, auVar25 = auVar25 & auVar24,
         (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff)) {
        iVar11 = std::__cxx11::string::compare
                           ((char *)option_pair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (iVar11 == 0) {
          options.is_descriptor = true;
        }
        else {
          iVar11 = std::__cxx11::string::compare
                             ((char *)option_pair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          if (iVar11 == 0) {
            file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int **)&file_proto._has_bits_;
            printer._0_8_ = 0x1e;
            file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int **)std::__cxx11::string::_M_create((ulong *)&file_proto,(ulong)&printer)
            ;
            file_proto._16_8_ = printer._0_8_;
            builtin_strncpy((char *)((long)file_proto.super_Message.super_MessageLite.
                                           _vptr_MessageLite + 0xe),"protobuf",8);
            builtin_strncpy((char *)((long)file_proto.super_Message.super_MessageLite.
                                           _vptr_MessageLite + 0x16),"/wkt.inc",8);
            *file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int *)0x672f7478652f2e2e;
            file_proto.super_Message.super_MessageLite._vptr_MessageLite[1] =
                 (_func_int *)0x72702f656c676f6f;
            file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = printer._0_8_;
            *(char *)((long)file_proto.super_Message.super_MessageLite._vptr_MessageLite +
                     printer._0_8_) = '\0';
            iVar11 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&file_proto);
            output = (FileDescriptorProto *)CONCAT44(extraout_var,iVar11);
            if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                &file_proto._has_bits_) {
              operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
            }
            options_00 = output;
            io::Printer::Printer(&printer,(ZeroCopyOutputStream *)output,'$');
            io::Printer::Print<>
                      (&printer,
                       "// This file is generated from the .proto files for the well-known\n// types. Do not edit!\n\n"
                      );
            io::Printer::Print<>
                      (&printer,
                       "ZEND_BEGIN_ARG_INFO_EX(arginfo_lookup, 0, 0, 1)\n  ZEND_ARG_INFO(0, key)\nZEND_END_ARG_INFO()\n\n"
                      );
            ppFVar6 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            pFVar14 = extraout_RDX;
            for (ppFVar17 = (files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start; ppFVar17 != ppFVar6;
                ppFVar17 = ppFVar17 + 1) {
              options_00 = &file_proto;
              (anonymous_namespace)::FilenameCName_abi_cxx11_
                        ((string *)options_00,(_anonymous_namespace_ *)*ppFVar17,pFVar14);
              io::Printer::Print<char[7],std::__cxx11::string>
                        (&printer,"static void $c_name$_AddDescriptor();\n",(char (*) [7])0x3f3fc7,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_00);
              pFVar14 = extraout_RDX_00;
              if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                  &file_proto._has_bits_) {
                operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
                pFVar14 = extraout_RDX_01;
              }
            }
            ppFVar6 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (ppFVar17 = (files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start; ppFVar17 != ppFVar6;
                ppFVar17 = ppFVar17 + 1) {
              p_Var4 = (_anonymous_namespace_ *)*ppFVar17;
              (anonymous_namespace)::FilenameCName_abi_cxx11_(&c_name,p_Var4,pFVar14);
              file_proto._has_bits_.has_bits_[0] = (uint32_t  [1])0x0;
              file_proto._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
              file_proto.dependency_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
              file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
              file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
              file_proto.message_type_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
              file_proto.dependency_.super_RepeatedPtrFieldBase.rep_ = (Rep *)&file_proto._has_bits_
              ;
              file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_ = &file_proto._has_bits_;
              (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                        (&metadata_filename,p_Var4,(FileDescriptor *)&file_proto,
                         (Options *)options_00);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&file_proto.super_Message.super_MessageLite._internal_metadata_);
              anon_unknown_2::FilenameToClassname(&metadata_classname,&metadata_filename);
              file_proto._has_bits_.has_bits_[0]._0_2_ = 0x5c;
              file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 1;
              file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                   (_func_int **)&file_proto._has_bits_;
              serialized.field_2._M_allocated_capacity._0_2_ = 0x5f;
              serialized._M_string_length = 1;
              serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
              StringReplace(&metadata_c_name,&metadata_classname,(string *)&file_proto,&serialized,
                            true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)serialized._M_dataplus._M_p != &serialized.field_2) {
                operator_delete(serialized._M_dataplus._M_p);
              }
              if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                  &file_proto._has_bits_) {
                operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
              }
              serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
              serialized.field_2._M_allocated_capacity._0_2_ = 0x5c;
              serialized._M_string_length = 1;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              __str.field_2._M_allocated_capacity._0_2_ = 0x5c5c;
              __str._M_string_length = 2;
              __str.field_2._M_local_buf[2] = '\0';
              StringReplace((string *)&file_proto,&metadata_classname,&serialized,&__str,true);
              std::__cxx11::string::operator=((string *)&metadata_classname,(string *)&file_proto);
              if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                  &file_proto._has_bits_) {
                operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)serialized._M_dataplus._M_p != &serialized.field_2) {
                operator_delete(serialized._M_dataplus._M_p);
              }
              FileDescriptorProto::FileDescriptorProto(&file_proto,(Arena *)0x0,false);
              FileDescriptor::CopyTo((FileDescriptor *)p_Var4,&file_proto);
              serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
              serialized._M_string_length = 0;
              serialized.field_2._M_allocated_capacity._0_2_ =
                   serialized.field_2._M_allocated_capacity._0_2_ & 0xff00;
              MessageLite::SerializeToString((MessageLite *)&file_proto,&serialized);
              __val = serialized._M_string_length;
              cVar16 = '\x01';
              if (9 < serialized._M_string_length) {
                sVar15 = serialized._M_string_length;
                cVar9 = '\x04';
                do {
                  cVar16 = cVar9;
                  if (sVar15 < 100) {
                    cVar16 = cVar16 + -2;
                    goto LAB_00279742;
                  }
                  if (sVar15 < 1000) {
                    cVar16 = cVar16 + -1;
                    goto LAB_00279742;
                  }
                  if (sVar15 < 10000) goto LAB_00279742;
                  bVar23 = 99999 < sVar15;
                  sVar15 = sVar15 / 10000;
                  cVar9 = cVar16 + '\x04';
                } while (bVar23);
                cVar16 = cVar16 + '\x01';
              }
LAB_00279742:
              pbVar22 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         p_Var4;
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct((ulong)&__str,cVar16);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
              io::Printer::
              Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[5],std::__cxx11::string>
                        (&printer,
                         "/* $filename$ */\n\nzend_class_entry* $metadata_c_name$_ce;\n\nconst char $c_name$_descriptor [$size$] = {\n"
                         ,(char (*) [9])"filename",pbVar22,(char (*) [7])0x3f3fc7,&c_name,
                         (char (*) [16])"metadata_c_name",&metadata_c_name,(char (*) [5])0x3e2353,
                         &__str);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p);
              }
              for (uVar20 = 0; uVar20 < serialized._M_string_length; uVar20 = uVar20 + uVar1) {
                uVar18 = 0;
                do {
                  std::__cxx11::string::substr((ulong)&local_130,(ulong)&serialized);
                  CEscape(&__str,&local_130);
                  io::Printer::Print<char[3],std::__cxx11::string>
                            (&printer,"\'$ch$\', ",(char (*) [3])0x448896,&__str);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__str._M_dataplus._M_p != &__str.field_2) {
                    operator_delete(__str._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    operator_delete(local_130._M_dataplus._M_p);
                  }
                  uVar1 = uVar18 + 1;
                } while ((uVar18 < 0x18) &&
                        (lVar19 = uVar18 + uVar20, uVar18 = uVar1,
                        lVar19 + 1U < serialized._M_string_length));
                io::Printer::Print<>(&printer,"\n");
              }
              io::Printer::
              Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string>
                        (&printer,
                         "};\n\nstatic void $c_name$_AddDescriptor() {\n  if (DescriptorPool_HasFile(\"$filename$\")) return;\n"
                         ,(char (*) [9])"filename",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          p_Var4,(char (*) [7])0x3f3fc7,&c_name,(char (*) [16])"metadata_c_name",
                         &metadata_c_name);
              if (0 < *(int *)(p_Var4 + 0x20)) {
                iVar11 = 0;
                do {
                  pFVar14 = FileDescriptor::dependency((FileDescriptor *)p_Var4,iVar11);
                  (anonymous_namespace)::FilenameCName_abi_cxx11_
                            (&__str,(_anonymous_namespace_ *)pFVar14,file);
                  io::Printer::Print<char[11],std::__cxx11::string>
                            (&printer,"  $dep_c_name$_AddDescriptor();\n",
                             (char (*) [11])"dep_c_name",&__str);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__str._M_dataplus._M_p != &__str.field_2) {
                    operator_delete(__str._M_dataplus._M_p);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < *(int *)(p_Var4 + 0x20));
              }
              options_00 = *(FileDescriptorProto **)p_Var4;
              result_00 = (string *)0x3f3fc7;
              io::Printer::
              Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[19],std::__cxx11::string>
                        (&printer,
                         "  DescriptorPool_AddDescriptor(\"$filename$\", $c_name$_descriptor,\n                               sizeof($c_name$_descriptor));\n}\n\nstatic PHP_METHOD($metadata_c_name$, initOnce) {\n  $c_name$_AddDescriptor();\n}\n\nstatic zend_function_entry $metadata_c_name$_methods[] = {\n  PHP_ME($metadata_c_name$, initOnce, arginfo_void, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $metadata_c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$metadata_classname$\",\n                   $metadata_c_name$_methods);\n\n  $metadata_c_name$_ce = zend_register_internal_class(&tmp_ce);\n}\n\n"
                         ,(char (*) [9])"filename",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_00,(char (*) [7])0x3f3fc7,&c_name,(char (*) [16])"metadata_c_name",
                         &metadata_c_name,(char (*) [19])"metadata_classname",&metadata_classname);
              if (0 < *(int *)(p_Var4 + 0x2c)) {
                lVar19 = 0;
                lVar21 = 0;
                do {
                  anon_unknown_2::GenerateCMessage
                            ((Descriptor *)(*(long *)(p_Var4 + 0x58) + lVar19),&printer);
                  lVar21 = lVar21 + 1;
                  lVar19 = lVar19 + 0x88;
                } while (lVar21 < *(int *)(p_Var4 + 0x2c));
              }
              if (0 < *(int *)(p_Var4 + 0x30)) {
                lVar19 = 0;
                lVar21 = 0;
                do {
                  anon_unknown_2::GenerateCEnum
                            ((EnumDescriptor *)(*(long *)(p_Var4 + 0x60) + lVar19),&printer);
                  lVar21 = lVar21 + 1;
                  lVar19 = lVar19 + 0x48;
                } while (lVar21 < *(int *)(p_Var4 + 0x30));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)serialized._M_dataplus._M_p != &serialized.field_2) {
                operator_delete(serialized._M_dataplus._M_p);
              }
              FileDescriptorProto::~FileDescriptorProto(&file_proto);
              pFVar14 = extraout_RDX_02;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_c_name._M_dataplus._M_p != &metadata_c_name.field_2) {
                operator_delete(metadata_c_name._M_dataplus._M_p);
                pFVar14 = extraout_RDX_03;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_classname._M_dataplus._M_p != &metadata_classname.field_2) {
                operator_delete(metadata_classname._M_dataplus._M_p);
                pFVar14 = extraout_RDX_04;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_filename._M_dataplus._M_p != &metadata_filename.field_2) {
                operator_delete(metadata_filename._M_dataplus._M_p);
                pFVar14 = extraout_RDX_05;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c_name._M_dataplus._M_p != &c_name.field_2) {
                operator_delete(c_name._M_dataplus._M_p);
                pFVar14 = extraout_RDX_06;
              }
            }
            io::Printer::Print<>(&printer,"static void WellKnownTypes_ModuleInit() {\n");
            pOVar5 = (Options *)
                     (files->
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (options_01 = (Options *)
                              (files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_start; options_01 != pOVar5;
                options_01 = (Options *)&options_01->aggregate_metadata_prefixes) {
              p_Var4 = *(_anonymous_namespace_ **)options_01;
              file_proto._has_bits_.has_bits_[0] = (uint32_t  [1])0x0;
              file_proto._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
              file_proto.dependency_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
              file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
              file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
              file_proto.message_type_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
              file_proto.dependency_.super_RepeatedPtrFieldBase.rep_ = (Rep *)&file_proto._has_bits_
              ;
              file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_ = &file_proto._has_bits_;
              (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                        (&c_name,p_Var4,(FileDescriptor *)&file_proto,options_01);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&file_proto.super_Message.super_MessageLite._internal_metadata_);
              anon_unknown_2::FilenameToClassname((string *)&file_proto,&c_name);
              metadata_classname._M_dataplus._M_p = (pointer)&metadata_classname.field_2;
              metadata_classname.field_2._M_allocated_capacity._0_2_ = 0x5c;
              metadata_classname._M_string_length = 1;
              metadata_c_name.field_2._M_allocated_capacity._0_2_ = 0x5f;
              metadata_c_name._M_string_length = 1;
              result_00 = (string *)0x1;
              metadata_c_name._M_dataplus._M_p = (pointer)&metadata_c_name.field_2;
              StringReplace(&metadata_filename,(string *)&file_proto,&metadata_classname,
                            &metadata_c_name,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_c_name._M_dataplus._M_p != &metadata_c_name.field_2) {
                operator_delete(metadata_c_name._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_classname._M_dataplus._M_p != &metadata_classname.field_2) {
                operator_delete(metadata_classname._M_dataplus._M_p);
              }
              io::Printer::Print<char[16],std::__cxx11::string>
                        (&printer,"  $metadata_c_name$_ModuleInit();\n",
                         (char (*) [16])"metadata_c_name",&metadata_filename);
              if (0 < *(int *)(p_Var4 + 0x2c)) {
                lVar19 = 0;
                lVar21 = 0;
                do {
                  anon_unknown_2::GenerateCInit
                            ((Descriptor *)(*(long *)(p_Var4 + 0x58) + lVar19),&printer);
                  lVar21 = lVar21 + 1;
                  lVar19 = lVar19 + 0x88;
                } while (lVar21 < *(int *)(p_Var4 + 0x2c));
              }
              if (0 < *(int *)(p_Var4 + 0x30)) {
                lVar19 = 0;
                lVar21 = 0;
                do {
                  anon_unknown_2::GenerateEnumCInit
                            ((EnumDescriptor *)(*(long *)(p_Var4 + 0x60) + lVar19),&printer);
                  lVar21 = lVar21 + 1;
                  lVar19 = lVar19 + 0x48;
                } while (lVar21 < *(int *)(p_Var4 + 0x30));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_filename._M_dataplus._M_p != &metadata_filename.field_2) {
                operator_delete(metadata_filename._M_dataplus._M_p);
              }
              if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                  &file_proto._has_bits_) {
                operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c_name._M_dataplus._M_p != &c_name.field_2) {
                operator_delete(c_name._M_dataplus._M_p);
              }
            }
            io::Printer::Print<>(&printer,"}\n");
            io::Printer::~Printer(&printer);
            if (output != (FileDescriptorProto *)0x0) {
              (*(output->super_Message).super_MessageLite._vptr_MessageLite[1])();
            }
          }
          else {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&file_proto,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                       ,0x905);
            pLVar13 = internal::LogMessage::operator<<
                                ((LogMessage *)&file_proto,"Unknown codegen option: ");
            pLVar13 = internal::LogMessage::operator<<
                                (pLVar13,option_pair.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            internal::LogFinisher::operator=((LogFinisher *)&printer,pLVar13);
            internal::LogMessage::~LogMessage((LogMessage *)&file_proto);
          }
        }
      }
      else {
        options.aggregate_metadata = true;
        ppVar2 = (protobuf *)
                 option_pair.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        pcVar3 = (char *)option_pair.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
        if ((long)pcVar3 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)pcVar3,"string length exceeds max size");
        }
        printer.variable_delimiter_ = '\0';
        printer._1_7_ = 0;
        printer.output_ = (ZeroCopyOutputStream *)0x0;
        printer.buffer_ = (char *)0x0;
        full_01.length_ = (size_type)"#";
        full_01.ptr_ = pcVar3;
        SplitStringAllowEmpty
                  (ppVar2,full_01,&printer.variable_delimiter_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)result_00);
        pZVar8 = printer.output_;
        for (pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       printer._0_8_;
            pbVar22 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pZVar8;
            pbVar22 = pbVar22 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_emplace_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&options.aggregate_metadata_prefixes,pbVar22);
          internal::LogMessage::LogMessage
                    ((LogMessage *)&file_proto,LOGLEVEL_INFO,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                     ,0x8fe);
          pLVar13 = internal::LogMessage::operator<<((LogMessage *)&file_proto,pbVar22);
          internal::LogFinisher::operator=((LogFinisher *)&c_name,pLVar13);
          internal::LogMessage::~LogMessage((LogMessage *)&file_proto);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&printer);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&option_pair);
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar7);
  }
  this_00 = &result;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  ppFVar17 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar6 = (files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar23 = ppFVar17 == ppFVar6;
  if (!bVar23) {
    do {
      bVar10 = Generate((Generator *)this_00,*ppFVar17,&options,generator_context,error);
      if (!bVar10) break;
      ppFVar17 = ppFVar17 + 1;
      bVar23 = ppFVar17 == ppFVar6;
    } while (!bVar23);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&options.aggregate_metadata_prefixes._M_t);
  return bVar23;
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  Options options;

  for (const auto& option : Split(parameter, ",", true)) {
    const std::vector<std::string> option_pair = Split(option, "=", true);
    if (HasPrefixString(option_pair[0], "aggregate_metadata")) {
      options.aggregate_metadata = true;
      for (const auto& prefix : Split(option_pair[1], "#", false)) {
        options.aggregate_metadata_prefixes.emplace(prefix);
        GOOGLE_LOG(INFO) << prefix;
      }
    } else if (option_pair[0] == "internal") {
      options.is_descriptor = true;
    } else if (option_pair[0] == "internal_generate_c_wkt") {
      GenerateCWellKnownTypes(files, generator_context);
    } else {
      GOOGLE_LOG(FATAL) << "Unknown codegen option: " << option_pair[0];
    }
  }

  for (auto file : files) {
    if (!Generate(file, options, generator_context, error)) {
      return false;
    }
  }

  return true;
}